

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

anon_unknown_dwarf_29a00 * __thiscall
anon_unknown.dwarf_29a00::openFile(anon_unknown_dwarf_29a00 *this,string *fileName)

{
  ostream *poVar1;
  
  std::ifstream::ifstream(this);
  std::ifstream::open((string *)this,(_Ios_Openmode)fileName);
  if (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 5) == 0) {
    return this;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Can\'t open file ",0x10)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(fileName->_M_dataplus)._M_p,fileName->_M_string_length)
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

ifstream openFile(const string & fileName) {
        ifstream fileStream;
        fileStream.open(fileName, fstream::in);
        if (fileStream.fail()) {
            cout << "Can't open file " << fileName << endl;
            exit(1);
        }
        return fileStream;
    }